

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::down(TimerMgr *this,size_t idx)

{
  pointer ppTVar1;
  ulong uVar2;
  size_t idx2;
  
  while( true ) {
    uVar2 = idx * 2;
    idx2 = idx;
    if ((uVar2 <= this->elements_size) &&
       (ppTVar1 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, idx2 = uVar2,
       ppTVar1[idx - 1]->mExpiredTime <= ppTVar1[idx * 2 + -1]->mExpiredTime)) {
      idx2 = idx;
    }
    if ((uVar2 < this->elements_size) &&
       (ppTVar1 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       ppTVar1[idx * 2]->mExpiredTime < ppTVar1[idx2 - 1]->mExpiredTime)) {
      idx2 = idx * 2 + 1;
    }
    if (idx2 == idx) break;
    swap(this,idx,idx2);
    idx = idx2;
  }
  return;
}

Assistant:

void down(size_t idx) {
		auto l = left(idx);
		auto r = right(idx);
		auto min = idx;

		auto offsetIdx = getOffset(idx);
		
		if(l <= this->elements_size) {
			auto offsetL = getOffset(l);
			if(this->elements[offsetL]->mExpiredTime < this->elements[offsetIdx]->mExpiredTime) {
				min = l;
			}
		}

		if(r <= this->elements_size) {
			auto offsetR = getOffset(r);
			auto offsetMin = getOffset(min);
			if(this->elements[offsetR]->mExpiredTime < this->elements[offsetMin]->mExpiredTime) {
				min = r;
			}
		}

		if(min != idx) {
			this->swap(idx,min);
			this->down(min);
		}	
	}